

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertEquals
          (UtestShell *this,bool failed,char *expected,char *actual,char *text,char *file,
          size_t line,TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  byte in_SIL;
  long *in_RDI;
  SimpleString *in_R9;
  undefined8 in_stack_00000010;
  UtestShell *in_stack_ffffffffffffff08;
  undefined1 local_98 [48];
  SimpleString *in_stack_ffffffffffffff98;
  SimpleString *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  UtestShell *in_stack_ffffffffffffffb8;
  CheckEqualFailure *in_stack_ffffffffffffffc0;
  SimpleString *text_00;
  
  pTVar1 = getTestResult(in_stack_ffffffffffffff08);
  (*pTVar1->_vptr_TestResult[10])();
  if ((in_SIL & 1) != 0) {
    text_00 = in_R9;
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff08);
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff08);
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff08);
    CheckEqualFailure::CheckEqualFailure
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,text_00
              );
    (**(code **)(*in_RDI + 0x138))(in_RDI,local_98,in_stack_00000010);
    CheckEqualFailure::~CheckEqualFailure((CheckEqualFailure *)0x123982);
    SimpleString::~SimpleString((SimpleString *)0x12398c);
    SimpleString::~SimpleString((SimpleString *)0x123996);
    SimpleString::~SimpleString((SimpleString *)0x1239a0);
  }
  return;
}

Assistant:

void UtestShell::assertEquals(bool failed, const char* expected, const char* actual, const char* text, const char* file, size_t line, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (failed)
        failWith(CheckEqualFailure(this, file, line, expected, actual, text), testTerminator);
}